

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

void __thiscall
Clasp::DefaultUnfoundedCheck::forwardUnsource(DefaultUnfoundedCheck *this,BodyPtr *n,bool add)

{
  AtomData AVar1;
  BodyNode *pBVar2;
  pointer pAVar3;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  NodeId aId;
  uint local_3c;
  VarVec *local_38;
  
  pBVar2 = n->node;
  puVar5 = (pBVar2->super_Node).adj_;
  puVar6 = (pBVar2->super_Node).sep_ + ((*(int *)&(pBVar2->super_Node).field_0x4 << 3) >> 0x1f);
  if (puVar5 != puVar6) {
    local_38 = &this->sourceQ_;
    do {
      local_3c = *puVar5;
      uVar4 = (ulong)local_3c;
      if (uVar4 != 0) {
        if (((*(uint *)&(n->node->super_Node).field_0x4 ^
             *(uint *)&(this->graph_->atoms_).ebo_.buf[uVar4].super_Node.field_0x4) & 0xfffffff) !=
            0) {
          return;
        }
        pAVar3 = (this->atoms_).ebo_.buf;
        AVar1 = pAVar3[uVar4];
        if (((int)AVar1 < 0) && (((uint)AVar1 & 0x1fffffff) == n->id)) {
          pAVar3[uVar4] = (AtomData)((uint)AVar1 & 0x7fffffff);
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (local_38,&local_3c);
        }
        if ((add) && (((uint)(this->atoms_).ebo_.buf[local_3c] & 0x1fffffff) == n->id)) {
          pushTodo(this,local_3c);
        }
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar6);
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::forwardUnsource(const BodyPtr& n, bool add) {
	for (const NodeId* x = n.node->heads_begin(), *end = n.node->heads_end(); x != end; ++x) {
		// Treat disjunctions as separate rules when it comes to source pointer propagation.
		// E.g. a | b :- B is (source) propagated as:
		// a :- B, and
		// b :- B
		if (*x != DependencyGraph::sentinel_atom) {
			NodeId aId = *x;
			if (graph_->getAtom(aId).scc != n.node->scc) {
				break;
			}
			if (atoms_[aId].hasSource() && atoms_[aId].watch() == n.id) {
				atoms_[aId].markSourceInvalid();
				sourceQ_.push_back(aId);
			}
			if (add && atoms_[aId].watch() == n.id) {
				pushTodo(aId);
			}
		}
	}
}